

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O1

Vector * VectorTriangleNormal(Vector v1,Vector v2,Vector v3)

{
  Vector *in_RDI;
  longdouble in_ST0;
  longdouble lVar1;
  longdouble lVar2;
  longdouble lVar3;
  undefined8 in_stack_00000008;
  
  lVar1 = (longdouble)CONCAT28(v2.x._0_2_,v1.z._8_8_) -
          (longdouble)CONCAT28(v1.x._0_2_,in_stack_00000008);
  lVar3 = (longdouble)CONCAT28(v3.x._0_2_,v2.z._8_8_) -
          (longdouble)CONCAT28(v1.x._0_2_,in_stack_00000008);
  sqrtl();
  lVar2 = _DAT_00109270;
  if (in_ST0 != (longdouble)0) {
    lVar2 = in_ST0;
  }
  if (NAN(in_ST0) || NAN((longdouble)0)) {
    lVar2 = in_ST0;
  }
  *(longdouble *)&in_RDI->x =
       (((longdouble)v2._8_10_ - (longdouble)v1._8_10_) *
        ((longdouble)v3._24_10_ - (longdouble)v1._24_10_) -
       ((longdouble)v2._24_10_ - (longdouble)v1._24_10_) *
       ((longdouble)v3._8_10_ - (longdouble)v1._8_10_)) / lVar2;
  *(longdouble *)&in_RDI->y =
       (((longdouble)v2._24_10_ - (longdouble)v1._24_10_) * lVar3 -
       ((longdouble)v3._24_10_ - (longdouble)v1._24_10_) * lVar1) / lVar2;
  *(longdouble *)&in_RDI->z =
       (lVar1 * ((longdouble)v3._8_10_ - (longdouble)v1._8_10_) -
       ((longdouble)v2._8_10_ - (longdouble)v1._8_10_) * lVar3) / lVar2;
  return in_RDI;
}

Assistant:

Vector VectorTriangleNormal(const Vector v1, const Vector v2, const Vector v3) { return VectorL2Normalization(VectorCrossProduct(VectorSubtraction(v2, v1), VectorSubtraction(v3, v1))); }